

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O1

void Util::Eigen2csv(string *file,MatrixXd *mat)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  ofstream f;
  int local_240;
  long local_230;
  filebuf local_228 [16];
  uint auStack_218 [56];
  ios_base local_138 [264];
  
  uVar1 = (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  uVar2 = (mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)file);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error: Unable to open file!",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 0x11;
  local_240 = (int)uVar1;
  if (0 < local_240) {
    iVar3 = (int)uVar2;
    uVar5 = 0;
    do {
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          std::ostream::_M_insert<double>
                    ((mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data
                     [(mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows * uVar6 + uVar5]);
          if (iVar3 - 1 != uVar6) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,", ",2);
          }
          uVar6 = uVar6 + 1;
        } while ((uVar2 & 0x7fffffff) != uVar6);
      }
      cVar4 = (char)(string *)&local_230;
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uVar1 & 0x7fffffff));
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Eigen2csv(std::string file, Eigen::MatrixXd mat){

		//locals
		int height = mat.rows();
		int width = mat.cols();

		//open file
		std::ofstream f;
		f.open(file);
		if(!f.is_open()){
			std::cout << "Error: Unable to open file!" << std::endl;
		}

		//set precision
		f << std::fixed << std::setprecision(17);

		//write
		for (int ii = 0; ii < height; ++ii) {
			for (int jj = 0; jj < width; ++jj) {
			
				// write element
				f << mat(ii,jj);

				//write comma
				if(jj != (width-1)){
					f << ", ";
				}

			}

			//newline
			f << std::endl;
		}

		f.close();


	}